

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::
Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
::eraseImpl(Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
            *this,size_t pos)

{
  size_t sVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  long local_60;
  long local_58;
  SearchKey local_50;
  Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
  *local_48;
  long *local_40;
  long local_38;
  
  lVar6 = pos * 0x20;
  local_60 = *(long *)this;
  local_38 = local_60 + lVar6;
  local_58 = *(long *)(this + 8) - local_60 >> 5;
  local_50._vptr_SearchKey = (_func_int **)&PTR_search_001b9050;
  local_48 = this + 0x20;
  local_40 = &local_60;
  _::BTreeImpl::erase((BTreeImpl *)(this + 0x28),(uint)pos,&local_50);
  lVar3 = *(long *)this;
  lVar5 = *(long *)(this + 8) - lVar3 >> 5;
  sVar1 = lVar5 - 1;
  if (sVar1 != pos) {
    local_38 = lVar3 + sVar1 * 0x20;
    local_50._vptr_SearchKey = (_func_int **)&PTR_search_001b9050;
    local_60 = lVar3;
    local_58 = lVar5;
    local_48 = this + 0x20;
    local_40 = &local_60;
    _::BTreeImpl::renumber((BTreeImpl *)(this + 0x28),(uint)sVar1,(uint)pos,&local_50);
    lVar3 = *(long *)this;
    puVar7 = (undefined8 *)(sVar1 * 0x20 + lVar3);
    puVar2 = (undefined8 *)(lVar3 + lVar6);
    lVar3 = *(long *)(lVar3 + lVar6);
    if (lVar3 != 0) {
      uVar4 = puVar2[1];
      *puVar2 = 0;
      puVar2[1] = 0;
      (*(code *)**(undefined8 **)puVar2[2])((undefined8 *)puVar2[2],lVar3,1,uVar4,uVar4,0);
    }
    *puVar2 = *puVar7;
    puVar2[1] = puVar7[1];
    puVar2[2] = puVar7[2];
    *puVar7 = 0;
    puVar7[1] = 0;
    *(undefined4 *)(puVar2 + 3) = *(undefined4 *)(puVar7 + 3);
  }
  ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry>::removeLast
            ((ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry> *)this);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}